

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall VmaBlockMetadata_TLSF::RemoveFreeBlock(VmaBlockMetadata_TLSF *this,Block *block)

{
  uint32_t *puVar1;
  Block *pBVar2;
  long lVar3;
  byte bVar4;
  uint16_t secondIndex;
  uint32_t uVar5;
  byte memoryClass;
  ulong size;
  
  pBVar2 = block->prevFree;
  if ((block->field_5).nextFree != (Block *)0x0) {
    ((block->field_5).nextFree)->prevFree = pBVar2;
  }
  if (pBVar2 == (Block *)0x0) {
    size = block->size;
    lVar3 = 0x3f;
    if (size != 0) {
      for (; size >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    memoryClass = 0x38 - ((byte)lVar3 ^ 0x3f);
    if (size < 0x101) {
      memoryClass = 0;
    }
    secondIndex = SizeToSecondIndex(this,size,memoryClass);
    uVar5 = GetListIndex(this,memoryClass,secondIndex);
    pBVar2 = (block->field_5).nextFree;
    this->m_FreeList[uVar5] = pBVar2;
    if (pBVar2 == (Block *)0x0) {
      bVar4 = (byte)secondIndex & 0x1f;
      puVar1 = this->m_InnerIsFreeBitmap + memoryClass;
      *puVar1 = *puVar1 & (-2 << bVar4 | 0xfffffffeU >> 0x20 - bVar4);
      if (*puVar1 == 0) {
        this->m_IsFreeBitmap = this->m_IsFreeBitmap & ~(uint)(1L << (memoryClass & 0x3f));
      }
    }
  }
  else {
    pBVar2->field_5 = block->field_5;
    size = block->size;
  }
  block->prevFree = block;
  (block->field_5).nextFree = (Block *)0x0;
  this->m_BlocksFreeCount = this->m_BlocksFreeCount - 1;
  this->m_BlocksFreeSize = this->m_BlocksFreeSize - size;
  return;
}

Assistant:

void VmaBlockMetadata_TLSF::RemoveFreeBlock(Block* block)
{
    VMA_ASSERT(block != m_NullBlock);
    VMA_ASSERT(block->IsFree());

    if (block->NextFree() != VMA_NULL)
        block->NextFree()->PrevFree() = block->PrevFree();
    if (block->PrevFree() != VMA_NULL)
        block->PrevFree()->NextFree() = block->NextFree();
    else
    {
        uint8_t memClass = SizeToMemoryClass(block->size);
        uint16_t secondIndex = SizeToSecondIndex(block->size, memClass);
        uint32_t index = GetListIndex(memClass, secondIndex);
        VMA_ASSERT(m_FreeList[index] == block);
        m_FreeList[index] = block->NextFree();
        if (block->NextFree() == VMA_NULL)
        {
            m_InnerIsFreeBitmap[memClass] &= ~(1U << secondIndex);
            if (m_InnerIsFreeBitmap[memClass] == 0)
                m_IsFreeBitmap &= ~(1UL << memClass);
        }
    }
    block->MarkTaken();
    block->UserData() = VMA_NULL;
    --m_BlocksFreeCount;
    m_BlocksFreeSize -= block->size;
}